

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O0

bool __thiscall cmPolicies::PolicyMap::IsDefined(PolicyMap *this,PolicyID id)

{
  bool bVar1;
  undefined1 local_15;
  PolicyID id_local;
  PolicyMap *this_local;
  
  bVar1 = std::bitset<320UL>::operator[](&this->Status,(long)(int)(id * 5));
  local_15 = true;
  if (!bVar1) {
    bVar1 = std::bitset<320UL>::operator[](&this->Status,(long)(int)(id * 5 + 1));
    local_15 = true;
    if (!bVar1) {
      bVar1 = std::bitset<320UL>::operator[](&this->Status,(long)(int)(id * 5 + 2));
      local_15 = true;
      if (!bVar1) {
        bVar1 = std::bitset<320UL>::operator[](&this->Status,(long)(int)(id * 5 + 4));
        local_15 = true;
        if (!bVar1) {
          local_15 = std::bitset<320UL>::operator[](&this->Status,(long)(int)(id * 5 + 3));
        }
      }
    }
  }
  return local_15;
}

Assistant:

bool cmPolicies::PolicyMap::IsDefined(cmPolicies::PolicyID id) const
{
  return this->Status[(POLICY_STATUS_COUNT * id) + OLD]
      || this->Status[(POLICY_STATUS_COUNT * id) + WARN]
      || this->Status[(POLICY_STATUS_COUNT * id) + NEW]
      || this->Status[(POLICY_STATUS_COUNT * id) + REQUIRED_ALWAYS]
      || this->Status[(POLICY_STATUS_COUNT * id) + REQUIRED_IF_USED];
}